

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::UniformFEDofHandler::GlobalDofIndices
          (UniformFEDofHandler *this,RefEl ref_el_type,glb_idx_t entity_index)

{
  dim_t dVar1;
  uint uVar2;
  element_type *peVar3;
  ostream *poVar4;
  const_reference this_00;
  long *plVar5;
  const_reference pvVar6;
  gdof_idx_t *end;
  gdof_idx_t *begin;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [379];
  RefElType local_35;
  size_type local_34;
  uint local_30;
  size_type no_covered_dofs;
  dim_t codim;
  glb_idx_t entity_index_local;
  UniformFEDofHandler *this_local;
  undefined1 auStack_18 [7];
  RefEl ref_el_type_local;
  
  no_covered_dofs = entity_index;
  _codim = this;
  this_local._7_1_ = ref_el_type.type_;
  dVar1 = lf::base::RefEl::Dimension((RefEl *)((long)&this_local + 7));
  local_30 = 2 - dVar1;
  local_35 = this_local._7_1_;
  local_34 = NumCoveredDofs(this,this_local._7_1_);
  peVar3 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
  uVar2 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)local_30);
  if (uVar2 <= no_covered_dofs) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar4 = std::operator<<(local_1b0,"Index ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,no_covered_dofs);
    std::operator<<(poVar4," out of range");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"(mesh_->NumEntities(codim) > entity_index)",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
               ,&local_219);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f0,&local_218,0x125,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"false",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
               ,&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"",(allocator<char> *)((long)&begin + 7));
    lf::base::AssertionFailed(&local_260,&local_288,0x125,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&begin + 7));
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    abort();
  }
  this_00 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)local_30);
  plVar5 = std::vector<long,_std::allocator<long>_>::data(this_00);
  pvVar6 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)local_30);
  std::span<const_long,_18446744073709551615UL>::span<const_long_*,_const_long_*>
            ((span<const_long,_18446744073709551615UL> *)auStack_18,
             plVar5 + (ulong)*pvVar6 * (ulong)no_covered_dofs,
             plVar5 + (ulong)*pvVar6 * (ulong)no_covered_dofs + local_34);
  return _auStack_18;
}

Assistant:

std::span<const gdof_idx_t> UniformFEDofHandler::GlobalDofIndices(
    lf::base::RefEl ref_el_type, glb_idx_t entity_index) const {
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  const size_type no_covered_dofs = NumCoveredDofs(ref_el_type);

  LF_ASSERT_MSG((mesh_->NumEntities(codim) > entity_index),
                "Index " << entity_index << " out of range");
  // Pointers to range of dof indices
  const gdof_idx_t *begin =
      dofs_[codim].data() +
      (static_cast<std::size_t>(num_dofs_[codim]) * entity_index);
  const gdof_idx_t *end = begin + no_covered_dofs;
  return {begin, end};
}